

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O2

adios2_error adios2_current_step(size_t *current_step,adios2_engine *engine)

{
  size_t sVar1;
  allocator local_50 [32];
  string local_30;
  
  std::__cxx11::string::string
            ((string *)&local_30,"for adios2_engine, in call to adios2_current_step",local_50);
  adios2::helper::CheckForNullptr<adios2_engine_const>(engine,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  sVar1 = (**(code **)(*(long *)engine + 0x20))(engine);
  *current_step = sVar1;
  return adios2_error_none;
}

Assistant:

adios2_error adios2_current_step(size_t *current_step, const adios2_engine *engine)
{
    try
    {
        adios2::helper::CheckForNullptr(engine,
                                        "for adios2_engine, in call to adios2_current_step");

        const adios2::core::Engine *engineCpp =
            reinterpret_cast<const adios2::core::Engine *>(engine);

        *current_step = engineCpp->CurrentStep();
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_current_step"));
    }
}